

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::set_optional<double>
          (Parser *this,string *name,string *alternative,double defaultValue,string *description,
          bool dominant)

{
  CmdBase *this_00;
  CmdBase *local_38;
  
  this_00 = (CmdBase *)operator_new(0xb8);
  CmdBase::CmdBase(this_00,name,alternative,description,false,dominant,false);
  this_00->_vptr_CmdBase = (_func_int **)&PTR__CmdBase_00126ba8;
  this_00[1]._vptr_CmdBase = (_func_int **)defaultValue;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,&local_38);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "", bool dominant = false) {
			auto command = new CmdArgument<T> { name, alternative, description, false, dominant };
			command->value = defaultValue;
			_commands.push_back(command);
		}